

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glsl.cpp
# Opt level: O1

void sf::priv::copyMatrix(Transform *source,Matrix<3UL,_3UL> *dest)

{
  float *pfVar1;
  
  pfVar1 = Transform::getMatrix(source);
  *(float *)dest = *pfVar1;
  *(float *)(dest + 4) = pfVar1[1];
  *(float *)(dest + 8) = pfVar1[3];
  *(float *)(dest + 0xc) = pfVar1[4];
  *(float *)(dest + 0x10) = pfVar1[5];
  *(float *)(dest + 0x14) = pfVar1[7];
  *(float *)(dest + 0x18) = pfVar1[0xc];
  *(float *)(dest + 0x1c) = pfVar1[0xd];
  *(float *)(dest + 0x20) = pfVar1[0xf];
  return;
}

Assistant:

void copyMatrix(const Transform& source, Matrix<3, 3>& dest)
    {
        const float* from = source.getMatrix(); // 4x4
        float* to = dest.array;                 // 3x3

        // Use only left-upper 3x3 block (for a 2D transform)
        to[0] = from[ 0]; to[1] = from[ 1]; to[2] = from[ 3];
        to[3] = from[ 4]; to[4] = from[ 5]; to[5] = from[ 7];
        to[6] = from[12]; to[7] = from[13]; to[8] = from[15];
    }